

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledLineOrder.cpp
# Opt level: O3

void anon_unknown.dwarf_311576::writeCopyRead(string *tempDir,int w,int h,int xs,int ys)

{
  long lVar1;
  Array2D<Imath_3_2::half> *pAVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 *puVar11;
  Rand32 RVar12;
  _Alloc_hider _Var13;
  bool bVar14;
  char cVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  ostream *poVar24;
  long *plVar25;
  uint *puVar26;
  undefined4 *puVar27;
  char *pcVar28;
  half *phVar29;
  int *piVar30;
  void *pvVar31;
  undefined8 *puVar32;
  undefined8 *puVar33;
  float *pfVar34;
  float *pfVar35;
  ChannelList *pCVar36;
  ChannelList *pCVar37;
  ulong uVar38;
  ulong *puVar39;
  long lVar40;
  uint uVar41;
  undefined4 uVar42;
  undefined8 uVar43;
  ulong *puVar44;
  half *phVar45;
  int tileY;
  pointer piVar46;
  undefined4 in_register_00000034;
  void *pvVar47;
  ulong uVar48;
  ulong uVar49;
  int tileX_1;
  Array2D<Imath_3_2::half> *pAVar50;
  int tileX_3;
  int iVar51;
  long lVar52;
  ulong *__s;
  byte bVar53;
  int tileY_1;
  ulong __n;
  int tileX;
  long lVar54;
  long lVar55;
  ulong *__s_00;
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar70;
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  long local_210;
  Array2D<Imath_3_2::half> ph1;
  ulong local_1e8;
  int local_1dc;
  uint local_1d8;
  allocator_type local_1d1;
  ulong *local_1d0;
  uint local_1c4;
  vector<int,_std::allocator<int>_> tileYs;
  FrameBuffer fb;
  Rand32 rand1_1;
  vector<int,_std::allocator<int>_> tileXs;
  TiledOutputFile out;
  long local_128;
  Rand32 rand1;
  Array2D<Imath_3_2::half> *pAStack_e0;
  pointer local_d8;
  string filename;
  Header hdr;
  
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename,tempDir,
             (long)&(tempDir->_M_dataplus)._M_p + CONCAT44(in_register_00000034,w));
  std::__cxx11::string::append((char *)&filename);
  uVar41 = 0;
  do {
    if ((uVar41 & 0xe) != 6) {
      bVar6 = false;
      local_1d8 = 0;
      bVar14 = true;
      do {
        bVar10 = bVar14;
        local_1dc = 0;
        bVar14 = true;
        do {
          bVar9 = bVar14;
          uVar19 = 0;
          bVar14 = true;
          do {
            bVar8 = bVar14;
            local_1c4 = uVar19;
            bVar53 = 0;
            bVar14 = true;
            do {
              bVar7 = bVar14;
              _Var13._M_p = filename._M_dataplus._M_p;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"LineOrder ",10);
              poVar24 = (ostream *)std::ostream::operator<<(&std::cout,local_1d8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", buffer ",9);
              poVar24 = std::ostream::_M_insert<bool>(SUB81(poVar24,0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", seek ",7);
              poVar24 = std::ostream::_M_insert<bool>(SUB81(poVar24,0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", levelMode 0, ",0xf);
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,"roundingMode ",0xd);
              poVar24 = (ostream *)std::ostream::operator<<(poVar24,local_1dc);
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", compression ",0xe);
              plVar25 = (long *)std::ostream::operator<<(poVar24,uVar41);
              std::ios::widen((char)*(undefined8 *)(*plVar25 + -0x18) + (char)plVar25);
              std::ostream::put((char)plVar25);
              std::ostream::flush();
              _out = (undefined1 *)0x0;
              fb._map._M_t._M_impl._0_8_ = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xaa;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x102;
              ph1._sizeX = 0;
              Imf_3_2::Header::Header
                        (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&ph1,1.0,INCREASING_Y,
                         ZIP_COMPRESSION);
              puVar26 = (uint *)Imf_3_2::Header::compression();
              *puVar26 = uVar41;
              puVar27 = (undefined4 *)Imf_3_2::Header::lineOrder();
              *puVar27 = 0;
              pcVar28 = (char *)Imf_3_2::Header::channels();
              Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
              Imf_3_2::ChannelList::insert(pcVar28,(Channel *)0x1ca214);
              _out = &DAT_3700000037;
              Imf_3_2::Header::setTileDescription((TileDescription *)&hdr);
              ph1._sizeX = 0x103;
              ph1._sizeY = 0xab;
              phVar29 = (half *)operator_new__(0x15a02);
              ph1._data = phVar29;
              fillPixels(&ph1,0xab,0x103);
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              Imf_3_2::Slice::Slice((Slice *)&out,HALF,(char *)phVar29,2,0x156,1,1,0.0,false,false);
              Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca214);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8)
              ;
              std::ostream::flush();
              remove(_Var13._M_p);
              iVar16 = Imf_3_2::globalThreadCount();
              Imf_3_2::TiledOutputFile::TiledOutputFile(&out,_Var13._M_p,&hdr,iVar16);
              Imf_3_2::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
              rand1._state = 0x5a5a5a5a;
              iVar16 = Imf_3_2::TiledOutputFile::numYTiles((int)&out);
              std::vector<int,_std::allocator<int>_>::vector
                        (&tileYs,(long)iVar16,(allocator_type *)&tileXs);
              iVar16 = Imf_3_2::TiledOutputFile::numXTiles((int)&out);
              std::vector<int,_std::allocator<int>_>::vector
                        (&tileXs,(long)iVar16,(allocator_type *)&rand1_1);
              iVar16 = -1;
              for (lVar54 = 0; iVar17 = Imf_3_2::TiledOutputFile::numYTiles((int)&out),
                  lVar54 < iVar17; lVar54 = lVar54 + 1) {
                if (bVar6) {
                  iVar17 = Imf_3_2::TiledOutputFile::numYTiles((int)&out);
                  tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar17 + iVar16] = (int)lVar54;
                }
                else {
                  tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar54] = (int)lVar54;
                }
                iVar16 = iVar16 + -1;
              }
              for (lVar54 = 0; iVar16 = Imf_3_2::TiledOutputFile::numXTiles((int)&out),
                  lVar54 < iVar16; lVar54 = lVar54 + 1) {
                tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[lVar54] = (int)lVar54;
              }
              if ((local_1c4 & 1) != 0) {
                for (lVar54 = 0; iVar16 = Imf_3_2::TiledOutputFile::numYTiles((int)&out),
                    piVar46 = tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start, lVar54 < iVar16; lVar54 = lVar54 + 1
                    ) {
                  iVar16 = Imf_3_2::TiledOutputFile::numYTiles((int)&out);
                  fVar56 = (float)Imath_3_2::Rand32::nextf();
                  iVar17 = (int)((float)(iVar16 + -1) * fVar56 + (1.0 - fVar56) * (float)(int)lVar54
                                + 0.5);
                  iVar16 = piVar46[lVar54];
                  piVar46[lVar54] =
                       tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar17];
                  tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar17] = iVar16;
                }
                for (lVar54 = 0; iVar16 = Imf_3_2::TiledOutputFile::numXTiles((int)&out),
                    piVar46 = tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start, lVar54 < iVar16; lVar54 = lVar54 + 1
                    ) {
                  iVar16 = Imf_3_2::TiledOutputFile::numXTiles((int)&out);
                  fVar56 = (float)Imath_3_2::Rand32::nextf();
                  iVar17 = (int)((float)(iVar16 + -1) * fVar56 + (1.0 - fVar56) * (float)(int)lVar54
                                + 0.5);
                  iVar16 = piVar46[lVar54];
                  piVar46[lVar54] =
                       tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar17];
                  tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar17] = iVar16;
                }
              }
              for (lVar54 = 0; iVar16 = Imf_3_2::TiledOutputFile::numYTiles((int)&out),
                  lVar54 < iVar16; lVar54 = lVar54 + 1) {
                for (lVar55 = 0; iVar16 = Imf_3_2::TiledOutputFile::numXTiles((int)&out),
                    lVar55 < iVar16; lVar55 = lVar55 + 1) {
                  Imf_3_2::TiledOutputFile::writeTile
                            ((int)&out,
                             tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar55],
                             tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar54]);
                }
              }
              if (tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              Imf_3_2::TiledOutputFile::~TiledOutputFile(&out);
              std::
              _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                           *)&fb);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8)
              ;
              std::ostream::flush();
              iVar16 = Imf_3_2::globalThreadCount();
              Imf_3_2::TiledInputFile::TiledInputFile((TiledInputFile *)&tileYs,_Var13._M_p,iVar16);
              Imf_3_2::TiledInputFile::header();
              piVar30 = (int *)Imf_3_2::Header::dataWindow();
              iVar16 = *piVar30;
              lVar55 = (long)piVar30[2] - (long)iVar16;
              uVar38 = lVar55 + 1;
              iVar17 = piVar30[1];
              iVar18 = piVar30[3] - iVar17;
              uVar19 = iVar18 + 1;
              local_1d0 = (ulong *)(ulong)uVar19;
              lVar54 = (long)(int)uVar19 * uVar38;
              uVar48 = lVar54 * 2;
              if (lVar54 < 0) {
                uVar48 = 0xffffffffffffffff;
              }
              pvVar31 = operator_new__(uVar48);
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              uVar43 = 2;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              Imf_3_2::Slice::Slice
                        ((Slice *)&out,HALF,
                         (char *)((long)pvVar31 + (long)iVar16 * -2 + (long)-iVar17 * uVar38 * 2),2,
                         uVar38 * 2,1,1,0.0,false,false);
              Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca214);
              Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&tileYs);
              uVar19 = (byte)~bVar53 & 1;
              if (local_1d8 == uVar19) {
                iVar16 = Imf_3_2::TiledInputFile::numYTiles((int)&tileYs);
                iVar16 = iVar16 + -1;
                iVar17 = -1;
                iVar70 = -1;
              }
              else {
                iVar16 = 0;
                iVar17 = Imf_3_2::TiledInputFile::numYTiles((int)&tileYs);
                iVar70 = 1;
              }
              for (; uVar42 = (undefined4)uVar43, iVar16 != iVar17; iVar16 = iVar16 + iVar70) {
                for (iVar23 = 0; iVar51 = Imf_3_2::TiledInputFile::numXTiles((int)&tileYs),
                    iVar23 < iVar51; iVar23 = iVar23 + 1) {
                  uVar43 = 0;
                  Imf_3_2::TiledInputFile::readTile((int)&tileYs,iVar23,iVar16);
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," comparing",10);
              std::ostream::flush();
              Imf_3_2::TiledInputFile::header();
              puVar32 = (undefined8 *)Imf_3_2::Header::displayWindow();
              puVar33 = (undefined8 *)Imf_3_2::Header::displayWindow();
              iVar16 = -(uint)((int)*puVar33 == (int)*puVar32);
              iVar17 = -(uint)((int)((ulong)*puVar33 >> 0x20) == (int)((ulong)*puVar32 >> 0x20));
              auVar71._4_4_ = iVar16;
              auVar71._0_4_ = iVar16;
              auVar71._8_4_ = iVar17;
              auVar71._12_4_ = iVar17;
              iVar16 = movmskpd(uVar42,auVar71);
              if ((iVar16 != 3) ||
                 (iVar17 = -(uint)((int)puVar33[1] == (int)puVar32[1]),
                 iVar70 = -(uint)((int)((ulong)puVar33[1] >> 0x20) ==
                                 (int)((ulong)puVar32[1] >> 0x20)), auVar57._4_4_ = iVar17,
                 auVar57._0_4_ = iVar17, auVar57._8_4_ = iVar70, auVar57._12_4_ = iVar70,
                 iVar17 = movmskpd((int)puVar33,auVar57), iVar17 != 3)) {
                __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xb7,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              puVar32 = (undefined8 *)Imf_3_2::Header::dataWindow();
              puVar33 = (undefined8 *)Imf_3_2::Header::dataWindow();
              iVar17 = -(uint)((int)*puVar33 == (int)*puVar32);
              iVar70 = -(uint)((int)((ulong)*puVar33 >> 0x20) == (int)((ulong)*puVar32 >> 0x20));
              auVar58._4_4_ = iVar17;
              auVar58._0_4_ = iVar17;
              auVar58._8_4_ = iVar70;
              auVar58._12_4_ = iVar70;
              iVar16 = movmskpd(iVar16,auVar58);
              if ((iVar16 != 3) ||
                 (iVar16 = -(uint)((int)puVar33[1] == (int)puVar32[1]),
                 iVar17 = -(uint)((int)((ulong)puVar33[1] >> 0x20) ==
                                 (int)((ulong)puVar32[1] >> 0x20)), auVar59._4_4_ = iVar16,
                 auVar59._0_4_ = iVar16, auVar59._8_4_ = iVar17, auVar59._12_4_ = iVar17,
                 iVar16 = movmskpd((int)puVar33,auVar59), iVar16 != 3)) {
                __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xb8,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pfVar34 = (float *)Imf_3_2::Header::pixelAspectRatio();
              fVar56 = *pfVar34;
              pfVar34 = (float *)Imf_3_2::Header::pixelAspectRatio();
              if ((fVar56 != *pfVar34) || (NAN(fVar56) || NAN(*pfVar34))) {
                __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xb9,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pfVar34 = (float *)Imf_3_2::Header::screenWindowCenter();
              pfVar35 = (float *)Imf_3_2::Header::screenWindowCenter();
              if ((((*pfVar34 != *pfVar35) || (NAN(*pfVar34) || NAN(*pfVar35))) ||
                  (pfVar34[1] != pfVar35[1])) || (NAN(pfVar34[1]) || NAN(pfVar35[1]))) {
                __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xbb,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pfVar34 = (float *)Imf_3_2::Header::screenWindowWidth();
              fVar56 = *pfVar34;
              pfVar34 = (float *)Imf_3_2::Header::screenWindowWidth();
              if ((fVar56 != *pfVar34) || (NAN(fVar56) || NAN(*pfVar34))) {
                __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xbc,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              piVar30 = (int *)Imf_3_2::Header::lineOrder();
              iVar16 = *piVar30;
              piVar30 = (int *)Imf_3_2::Header::lineOrder();
              if (iVar16 != *piVar30) {
                __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xbd,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              piVar30 = (int *)Imf_3_2::Header::compression();
              iVar16 = *piVar30;
              piVar30 = (int *)Imf_3_2::Header::compression();
              if (iVar16 != *piVar30) {
                __assert_fail("in.header ().compression () == hdr.compression ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xbe,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pCVar36 = (ChannelList *)Imf_3_2::Header::channels();
              pCVar37 = (ChannelList *)Imf_3_2::Header::channels();
              cVar15 = Imf_3_2::ChannelList::operator==(pCVar36,pCVar37);
              if (cVar15 == '\0') {
                __assert_fail("in.header ().channels () == hdr.channels ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xbf,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              if (-1 < iVar18) {
                uVar48 = 0;
                phVar45 = phVar29;
                pvVar47 = pvVar31;
                do {
                  if (-1 < (int)lVar55) {
                    uVar49 = 0;
                    do {
                      fVar56 = *(float *)(_imath_half_to_float_table + (ulong)phVar45[uVar49]._h * 4
                                         );
                      pfVar34 = (float *)(_imath_half_to_float_table +
                                         (ulong)*(ushort *)((long)pvVar47 + uVar49 * 2) * 4);
                      if ((fVar56 != *pfVar34) || (NAN(fVar56) || NAN(*pfVar34))) {
                        __assert_fail("ph1[y][x] == ph2[y][x]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                                      ,0xc3,
                                      "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                                     );
                      }
                      uVar49 = uVar49 + 1;
                    } while ((uVar38 & 0xffffffff) != uVar49);
                  }
                  uVar48 = uVar48 + 1;
                  pvVar47 = (void *)((long)pvVar47 + uVar38 * 2);
                  phVar45 = phVar45 + 0xab;
                } while ((ulong *)uVar48 != local_1d0);
              }
              std::
              _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                           *)&fb);
              operator_delete__(pvVar31);
              Imf_3_2::TiledInputFile::~TiledInputFile((TiledInputFile *)&tileYs);
              remove(_Var13._M_p);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
              std::ostream::put('X');
              std::ostream::flush();
              operator_delete__(phVar29);
              Imf_3_2::Header::~Header(&hdr);
              _Var13 = filename._M_dataplus;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"LineOrder ",10);
              poVar24 = (ostream *)std::ostream::operator<<(&std::cout,local_1d8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", buffer ",9);
              poVar24 = std::ostream::_M_insert<bool>(SUB81(poVar24,0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", seek ",7);
              poVar24 = std::ostream::_M_insert<bool>(SUB81(poVar24,0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", levelMode 1, ",0xf);
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,"roundingMode ",0xd);
              poVar24 = (ostream *)std::ostream::operator<<(poVar24,local_1dc);
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", compression ",0xe);
              plVar25 = (long *)std::ostream::operator<<(poVar24,uVar41);
              std::ios::widen((char)*(undefined8 *)(*plVar25 + -0x18) + (char)plVar25);
              std::ostream::put((char)plVar25);
              std::ostream::flush();
              _out = (undefined1 *)0x0;
              fb._map._M_t._M_impl._0_8_ = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xaa;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x102;
              ph1._sizeX = 0;
              Imf_3_2::Header::Header
                        (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&ph1,1.0,INCREASING_Y,
                         ZIP_COMPRESSION);
              puVar26 = (uint *)Imf_3_2::Header::compression();
              *puVar26 = uVar41;
              puVar27 = (undefined4 *)Imf_3_2::Header::lineOrder();
              *puVar27 = 0;
              pcVar28 = (char *)Imf_3_2::Header::channels();
              Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
              Imf_3_2::ChannelList::insert(pcVar28,(Channel *)0x1ca214);
              _out = &DAT_3700000037;
              Imf_3_2::Header::setTileDescription((TileDescription *)&hdr);
              rand1._state = 0;
              pAStack_e0 = (Array2D<Imath_3_2::half> *)0x0;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8)
              ;
              std::ostream::flush();
              remove(_Var13._M_p);
              iVar16 = Imf_3_2::globalThreadCount();
              Imf_3_2::TiledOutputFile::TiledOutputFile
                        ((TiledOutputFile *)&ph1,_Var13._M_p,&hdr,iVar16);
              local_1d0 = (ulong *)_Var13._M_p;
              uVar20 = Imf_3_2::TiledOutputFile::numLevels();
              uVar48 = (ulong)uVar20;
              __n = (ulong)(int)uVar20;
              auVar3._8_8_ = 0;
              auVar3._0_8_ = __n;
              uVar38 = SUB168(auVar3 * ZEXT816(0x18),0);
              uVar49 = uVar38 + 8;
              if (0xfffffffffffffff7 < uVar38) {
                uVar49 = 0xffffffffffffffff;
              }
              if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
                uVar49 = 0xffffffffffffffff;
              }
              puVar39 = (ulong *)operator_new__(uVar49);
              *puVar39 = __n;
              if (uVar20 != 0) {
                memset((Array2D<Imath_3_2::half> *)(puVar39 + 1),0,
                       ((uVar38 - 0x18) / 0x18) * 0x18 + 0x18);
              }
              if (pAStack_e0 != (Array2D<Imath_3_2::half> *)0x0) {
                phVar29 = pAStack_e0[-1]._data;
                pAVar50 = pAStack_e0 + -1;
                if (phVar29 != (half *)0x0) {
                  lVar54 = (long)phVar29 * 0x18;
                  do {
                    pvVar31 = *(void **)((long)&pAVar50->_data + lVar54);
                    if (pvVar31 != (void *)0x0) {
                      operator_delete__(pvVar31);
                    }
                    lVar54 = lVar54 + -0x18;
                  } while (lVar54 != 0);
                }
                operator_delete__(&pAVar50->_data,(long)phVar29 * 0x18 + 8);
              }
              pAStack_e0 = (Array2D<Imath_3_2::half> *)(puVar39 + 1);
              rand1._state = __n;
              rand1_1._state = 0x5a5a5a5a;
              std::vector<int,_std::allocator<int>_>::vector(&tileYs,__n,(allocator_type *)&out);
              puVar39 = local_1d0;
              if (0 < (int)uVar20) {
                lVar54 = uVar48 - 1;
                auVar60._8_4_ = (int)lVar54;
                auVar60._0_8_ = lVar54;
                auVar60._12_4_ = (int)((ulong)lVar54 >> 0x20);
                auVar60 = auVar60 ^ _DAT_001bcaf0;
                uVar38 = 0;
                auVar69 = _DAT_001bcae0;
                do {
                  auVar71 = auVar69 ^ _DAT_001bcaf0;
                  auVar73._0_4_ = -(uint)(auVar60._0_4_ < auVar71._0_4_);
                  auVar73._4_4_ = -(uint)(auVar60._4_4_ < auVar71._4_4_);
                  auVar73._8_4_ = -(uint)(auVar60._8_4_ < auVar71._8_4_);
                  auVar73._12_4_ = -(uint)(auVar60._12_4_ < auVar71._12_4_);
                  iVar16 = -(uint)(auVar71._4_4_ == auVar60._4_4_);
                  iVar17 = -(uint)(auVar71._12_4_ == auVar60._12_4_);
                  auVar74._4_4_ = iVar16;
                  auVar74._0_4_ = iVar16;
                  auVar74._8_4_ = iVar17;
                  auVar74._12_4_ = iVar17;
                  auVar72._4_4_ = auVar73._4_4_;
                  auVar72._0_4_ = auVar73._4_4_;
                  auVar72._8_4_ = auVar73._12_4_;
                  auVar72._12_4_ = auVar73._12_4_;
                  auVar72 = auVar72 | auVar74 & auVar73;
                  if ((~auVar72._0_4_ & 1) != 0) {
                    tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar38] = (int)uVar38;
                  }
                  if (((auVar72 ^ _DAT_001c0ca0) & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                  {
                    tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar38 + 1] = (int)uVar38 + 1;
                  }
                  uVar38 = uVar38 + 2;
                  lVar54 = auVar69._8_8_;
                  auVar69._0_8_ = auVar69._0_8_ + 2;
                  auVar69._8_8_ = lVar54 + 2;
                } while ((uVar20 + 1 & 0xfffffffe) != uVar38);
                if ((local_1c4 & 1) != 0) {
                  uVar38 = 0;
                  do {
                    piVar46 = tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    fVar56 = (float)Imath_3_2::Rand32::nextf();
                    iVar17 = (int)(fVar56 * (float)(int)(uVar20 - 1) +
                                   (1.0 - fVar56) * (float)(int)uVar38 + 0.5);
                    iVar16 = piVar46[uVar38];
                    piVar46[uVar38] =
                         tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar17];
                    tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar17] = iVar16;
                    uVar38 = uVar38 + 1;
                  } while (uVar48 != uVar38);
                }
                uVar38 = 0;
                do {
                  iVar16 = tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar38];
                  iVar17 = Imf_3_2::TiledOutputFile::levelWidth((int)&ph1);
                  iVar18 = Imf_3_2::TiledOutputFile::levelHeight((int)&ph1);
                  pAVar50 = pAStack_e0;
                  lVar55 = (long)iVar17;
                  lVar54 = iVar18 * lVar55;
                  uVar49 = lVar54 * 2;
                  if (lVar54 < 0) {
                    uVar49 = 0xffffffffffffffff;
                  }
                  phVar29 = (half *)operator_new__(uVar49);
                  pAVar2 = pAVar50 + iVar16;
                  if (pAVar2->_data != (half *)0x0) {
                    operator_delete__(pAVar2->_data);
                    pAVar50 = pAStack_e0;
                  }
                  pAVar2->_sizeX = (long)iVar18;
                  pAVar2->_sizeY = lVar55;
                  pAVar2->_data = phVar29;
                  fillPixels(pAVar50 + iVar16,iVar17,iVar18);
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                       0xffffffff00000000;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  Imf_3_2::Slice::Slice
                            ((Slice *)&out,HALF,(char *)pAStack_e0[iVar16]._data,2,lVar55 * 2,1,1,
                             0.0,false,false);
                  Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca214);
                  Imf_3_2::TiledOutputFile::setFrameBuffer((FrameBuffer *)&ph1);
                  iVar16 = Imf_3_2::TiledOutputFile::numYTiles((int)&ph1);
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)&out,(long)iVar16,
                             (allocator_type *)&tileXs);
                  iVar16 = Imf_3_2::TiledOutputFile::numXTiles((int)&ph1);
                  std::vector<int,_std::allocator<int>_>::vector(&tileXs,(long)iVar16,&local_1d1);
                  iVar16 = -1;
                  for (lVar54 = 0; iVar17 = Imf_3_2::TiledOutputFile::numYTiles((int)&ph1),
                      lVar54 < iVar17; lVar54 = lVar54 + 1) {
                    if (bVar6) {
                      iVar17 = Imf_3_2::TiledOutputFile::numYTiles((int)&ph1);
                      *(int *)(_out + (long)(iVar17 + iVar16) * 4) = (int)lVar54;
                    }
                    else {
                      *(int *)(_out + lVar54 * 4) = (int)lVar54;
                    }
                    iVar16 = iVar16 + -1;
                  }
                  for (lVar54 = 0; iVar16 = Imf_3_2::TiledOutputFile::numXTiles((int)&ph1),
                      lVar54 < iVar16; lVar54 = lVar54 + 1) {
                    tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar54] = (int)lVar54;
                  }
                  if ((local_1c4 & 1) != 0) {
                    for (lVar54 = 0; iVar16 = Imf_3_2::TiledOutputFile::numYTiles((int)&ph1),
                        puVar11 = _out, lVar54 < iVar16; lVar54 = lVar54 + 1) {
                      iVar16 = Imf_3_2::TiledOutputFile::numYTiles((int)&ph1);
                      fVar56 = (float)Imath_3_2::Rand32::nextf();
                      lVar55 = (long)(int)((float)(iVar16 + -1) * fVar56 +
                                           (1.0 - fVar56) * (float)(int)lVar54 + 0.5);
                      uVar42 = *(undefined4 *)(puVar11 + lVar54 * 4);
                      *(undefined4 *)(puVar11 + lVar54 * 4) = *(undefined4 *)(_out + lVar55 * 4);
                      *(undefined4 *)(_out + lVar55 * 4) = uVar42;
                    }
                    for (lVar54 = 0; iVar16 = Imf_3_2::TiledOutputFile::numXTiles((int)&ph1),
                        piVar46 = tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start, lVar54 < iVar16;
                        lVar54 = lVar54 + 1) {
                      iVar16 = Imf_3_2::TiledOutputFile::numXTiles((int)&ph1);
                      fVar56 = (float)Imath_3_2::Rand32::nextf();
                      iVar17 = (int)((float)(iVar16 + -1) * fVar56 +
                                     (1.0 - fVar56) * (float)(int)lVar54 + 0.5);
                      iVar16 = piVar46[lVar54];
                      piVar46[lVar54] =
                           tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar17];
                      tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar17] = iVar16;
                    }
                  }
                  for (lVar54 = 0; iVar16 = Imf_3_2::TiledOutputFile::numYTiles((int)&ph1),
                      puVar39 = local_1d0, lVar54 < iVar16; lVar54 = lVar54 + 1) {
                    for (lVar55 = 0; iVar16 = Imf_3_2::TiledOutputFile::numXTiles((int)&ph1),
                        lVar55 < iVar16; lVar55 = lVar55 + 1) {
                      Imf_3_2::TiledOutputFile::writeTile
                                ((int)&ph1,
                                 tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar55],
                                 *(int *)(_out + lVar54 * 4));
                    }
                  }
                  if (tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)tileXs.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)tileXs.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (_out != (undefined1 *)0x0) {
                    operator_delete(_out,local_128 - (long)_out);
                  }
                  std::
                  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                               *)&fb);
                  uVar38 = uVar38 + 1;
                } while (uVar38 != uVar48);
              }
              if (tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              Imf_3_2::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&ph1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8)
              ;
              std::ostream::flush();
              iVar16 = Imf_3_2::globalThreadCount();
              Imf_3_2::TiledInputFile::TiledInputFile((TiledInputFile *)&ph1,(char *)puVar39,iVar16)
              ;
              Imf_3_2::TiledInputFile::header();
              piVar30 = (int *)Imf_3_2::Header::dataWindow();
              iVar16 = *piVar30;
              iVar17 = piVar30[1];
              uVar38 = (long)iVar16;
              uVar20 = Imf_3_2::TiledInputFile::numLevels();
              Imf_3_2::Array<Imf_3_2::Array2D<Imath_3_2::half>_>::Array
                        ((Array<Imf_3_2::Array2D<Imath_3_2::half>_> *)&tileYs,(long)(int)uVar20);
              uVar48 = 0;
              while( true ) {
                uVar42 = (undefined4)uVar38;
                iVar18 = Imf_3_2::TiledInputFile::numLevels();
                if ((long)iVar18 <= (long)uVar48) break;
                iVar18 = Imf_3_2::TiledInputFile::levelWidth((int)&ph1);
                iVar70 = Imf_3_2::TiledInputFile::levelHeight((int)&ph1);
                piVar46 = tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                lVar55 = (long)iVar18;
                lVar54 = iVar70 * lVar55;
                uVar38 = lVar54 * 2;
                if (lVar54 < 0) {
                  uVar38 = 0xffffffffffffffff;
                }
                pvVar31 = operator_new__(uVar38);
                plVar25 = (long *)(piVar46 + uVar48 * 6);
                if ((void *)plVar25[2] != (void *)0x0) {
                  operator_delete__((void *)plVar25[2]);
                  piVar46 = tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                }
                *plVar25 = (long)iVar70;
                plVar25[1] = lVar55;
                plVar25[2] = (long)pvVar31;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                     fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000
                ;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                uVar38 = 2;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                Imf_3_2::Slice::Slice
                          ((Slice *)&out,HALF,
                           (char *)(*(long *)(piVar46 + uVar48 * 6 + 2) * -(long)iVar17 * 2 +
                                    *(long *)(piVar46 + uVar48 * 6 + 4) + (long)iVar16 * -2),2,
                           lVar55 * 2,1,1,0.0,false,false);
                Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca214);
                Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&ph1);
                if (local_1d8 == uVar19) {
                  iVar18 = Imf_3_2::TiledInputFile::numYTiles((int)&ph1);
                  iVar18 = iVar18 + -1;
                  iVar70 = -1;
                  iVar23 = -1;
                }
                else {
                  iVar70 = Imf_3_2::TiledInputFile::numYTiles((int)&ph1);
                  iVar23 = 1;
                  iVar18 = 0;
                }
                for (; iVar18 != iVar70; iVar18 = iVar18 + iVar23) {
                  for (iVar51 = 0; iVar21 = Imf_3_2::TiledInputFile::numXTiles((int)&ph1),
                      iVar51 < iVar21; iVar51 = iVar51 + 1) {
                    uVar38 = uVar48 & 0xffffffff;
                    Imf_3_2::TiledInputFile::readTile((int)&ph1,iVar51,iVar18);
                  }
                }
                std::
                _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                             *)&fb);
                uVar48 = uVar48 + 1;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," comparing",10);
              std::ostream::flush();
              Imf_3_2::TiledInputFile::header();
              puVar32 = (undefined8 *)Imf_3_2::Header::displayWindow();
              puVar33 = (undefined8 *)Imf_3_2::Header::displayWindow();
              iVar16 = -(uint)((int)*puVar33 == (int)*puVar32);
              iVar17 = -(uint)((int)((ulong)*puVar33 >> 0x20) == (int)((ulong)*puVar32 >> 0x20));
              auVar61._4_4_ = iVar16;
              auVar61._0_4_ = iVar16;
              auVar61._8_4_ = iVar17;
              auVar61._12_4_ = iVar17;
              iVar16 = movmskpd(uVar42,auVar61);
              if ((iVar16 != 3) ||
                 (iVar17 = -(uint)((int)puVar33[1] == (int)puVar32[1]),
                 iVar18 = -(uint)((int)((ulong)puVar33[1] >> 0x20) ==
                                 (int)((ulong)puVar32[1] >> 0x20)), auVar62._4_4_ = iVar17,
                 auVar62._0_4_ = iVar17, auVar62._8_4_ = iVar18, auVar62._12_4_ = iVar18,
                 iVar17 = movmskpd((int)puVar33,auVar62), iVar17 != 3)) {
                __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x17b,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              puVar32 = (undefined8 *)Imf_3_2::Header::dataWindow();
              puVar33 = (undefined8 *)Imf_3_2::Header::dataWindow();
              iVar17 = -(uint)((int)*puVar33 == (int)*puVar32);
              iVar18 = -(uint)((int)((ulong)*puVar33 >> 0x20) == (int)((ulong)*puVar32 >> 0x20));
              auVar63._4_4_ = iVar17;
              auVar63._0_4_ = iVar17;
              auVar63._8_4_ = iVar18;
              auVar63._12_4_ = iVar18;
              iVar16 = movmskpd(iVar16,auVar63);
              if ((iVar16 != 3) ||
                 (iVar16 = -(uint)((int)puVar33[1] == (int)puVar32[1]),
                 iVar17 = -(uint)((int)((ulong)puVar33[1] >> 0x20) ==
                                 (int)((ulong)puVar32[1] >> 0x20)), auVar64._4_4_ = iVar16,
                 auVar64._0_4_ = iVar16, auVar64._8_4_ = iVar17, auVar64._12_4_ = iVar17,
                 iVar16 = movmskpd((int)puVar33,auVar64), iVar16 != 3)) {
                __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x17c,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pfVar34 = (float *)Imf_3_2::Header::pixelAspectRatio();
              fVar56 = *pfVar34;
              pfVar34 = (float *)Imf_3_2::Header::pixelAspectRatio();
              if ((fVar56 != *pfVar34) || (NAN(fVar56) || NAN(*pfVar34))) {
                __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x17d,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pfVar34 = (float *)Imf_3_2::Header::screenWindowCenter();
              pfVar35 = (float *)Imf_3_2::Header::screenWindowCenter();
              if ((((*pfVar34 != *pfVar35) || (NAN(*pfVar34) || NAN(*pfVar35))) ||
                  (pfVar34[1] != pfVar35[1])) || (NAN(pfVar34[1]) || NAN(pfVar35[1]))) {
                __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x17f,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pfVar34 = (float *)Imf_3_2::Header::screenWindowWidth();
              fVar56 = *pfVar34;
              pfVar34 = (float *)Imf_3_2::Header::screenWindowWidth();
              if ((fVar56 != *pfVar34) || (NAN(fVar56) || NAN(*pfVar34))) {
                __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x180,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              piVar30 = (int *)Imf_3_2::Header::lineOrder();
              iVar16 = *piVar30;
              piVar30 = (int *)Imf_3_2::Header::lineOrder();
              if (iVar16 != *piVar30) {
                __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x181,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              piVar30 = (int *)Imf_3_2::Header::compression();
              iVar16 = *piVar30;
              piVar30 = (int *)Imf_3_2::Header::compression();
              if (iVar16 != *piVar30) {
                __assert_fail("in.header ().compression () == hdr.compression ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x182,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pCVar36 = (ChannelList *)Imf_3_2::Header::channels();
              pCVar37 = (ChannelList *)Imf_3_2::Header::channels();
              cVar15 = Imf_3_2::ChannelList::operator==(pCVar36,pCVar37);
              if (cVar15 == '\0') {
                __assert_fail("in.header ().channels () == hdr.channels ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x183,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              if (0 < (int)uVar20) {
                uVar38 = 0;
                do {
                  lVar55 = 0;
                  for (lVar54 = 0; iVar16 = Imf_3_2::TiledInputFile::levelHeight((int)&ph1),
                      lVar54 < iVar16; lVar54 = lVar54 + 1) {
                    lVar52 = 0;
                    while (iVar16 = Imf_3_2::TiledInputFile::levelWidth((int)&ph1), lVar52 < iVar16)
                    {
                      fVar56 = *(float *)(_imath_half_to_float_table +
                                         (ulong)*(ushort *)
                                                 (*(long *)(tileYs.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                  uVar38 * 6 + 2) * lVar55 +
                                                  *(long *)(tileYs.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                  uVar38 * 6 + 4) + lVar52 * 2) * 4);
                      phVar29 = pAStack_e0[uVar38]._data + lVar52;
                      lVar52 = lVar52 + 1;
                      pfVar34 = (float *)(_imath_half_to_float_table +
                                         (ulong)*(uint16_t *)
                                                 ((long)&phVar29->_h +
                                                 pAStack_e0[uVar38]._sizeY * lVar55) * 4);
                      if ((fVar56 != *pfVar34) || (NAN(fVar56) || NAN(*pfVar34))) {
                        __assert_fail("(levels2[l])[y][x] == (levels[l])[y][x]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                                      ,0x188,
                                      "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                                     );
                      }
                    }
                    lVar55 = lVar55 + 2;
                  }
                  uVar38 = uVar38 + 1;
                } while (uVar38 != uVar20);
              }
              Imf_3_2::Array<Imf_3_2::Array2D<Imath_3_2::half>_>::~Array
                        ((Array<Imf_3_2::Array2D<Imath_3_2::half>_> *)&tileYs);
              Imf_3_2::TiledInputFile::~TiledInputFile((TiledInputFile *)&ph1);
              remove((char *)local_1d0);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
              std::ostream::put('X');
              std::ostream::flush();
              Imf_3_2::Array<Imf_3_2::Array2D<Imath_3_2::half>_>::~Array
                        ((Array<Imf_3_2::Array2D<Imath_3_2::half>_> *)&rand1);
              Imf_3_2::Header::~Header(&hdr);
              _Var13 = filename._M_dataplus;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"LineOrder ",10);
              poVar24 = (ostream *)std::ostream::operator<<(&std::cout,local_1d8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", buffer ",9);
              poVar24 = std::ostream::_M_insert<bool>(SUB81(poVar24,0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", seek ",7);
              poVar24 = std::ostream::_M_insert<bool>(SUB81(poVar24,0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", levelMode 2, ",0xf);
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,"roundingMode ",0xd);
              poVar24 = (ostream *)std::ostream::operator<<(poVar24,local_1dc);
              std::__ostream_insert<char,std::char_traits<char>>(poVar24,", compression ",0xe);
              plVar25 = (long *)std::ostream::operator<<(poVar24,uVar41);
              std::ios::widen((char)*(undefined8 *)(*plVar25 + -0x18) + (char)plVar25);
              std::ostream::put((char)plVar25);
              std::ostream::flush();
              _out = (undefined1 *)0x0;
              fb._map._M_t._M_impl._0_8_ = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xaa;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x102;
              ph1._sizeX = 0;
              Imf_3_2::Header::Header
                        (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&ph1,1.0,INCREASING_Y,
                         ZIP_COMPRESSION);
              puVar26 = (uint *)Imf_3_2::Header::compression();
              *puVar26 = uVar41;
              puVar27 = (undefined4 *)Imf_3_2::Header::lineOrder();
              *puVar27 = 0;
              pcVar28 = (char *)Imf_3_2::Header::channels();
              Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
              Imf_3_2::ChannelList::insert(pcVar28,(Channel *)0x1ca214);
              _out = &DAT_3700000037;
              Imf_3_2::Header::setTileDescription((TileDescription *)&hdr);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8)
              ;
              std::ostream::flush();
              remove(_Var13._M_p);
              iVar16 = Imf_3_2::globalThreadCount();
              Imf_3_2::TiledOutputFile::TiledOutputFile
                        ((TiledOutputFile *)&ph1,_Var13._M_p,&hdr,iVar16);
              iVar16 = Imf_3_2::TiledOutputFile::numYLevels();
              iVar17 = Imf_3_2::TiledOutputFile::numXLevels();
              lVar54 = (long)iVar17;
              uVar48 = iVar16 * lVar54;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = uVar48;
              uVar38 = SUB168(auVar4 * ZEXT816(0x18),0);
              uVar49 = uVar38 + 8;
              if (0xfffffffffffffff7 < uVar38) {
                uVar49 = 0xffffffffffffffff;
              }
              if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
                uVar49 = 0xffffffffffffffff;
              }
              puVar39 = (ulong *)operator_new__(uVar49);
              *puVar39 = uVar48;
              __s = puVar39 + 1;
              if (uVar48 != 0) {
                memset(__s,0,((uVar38 - 0x18) / 0x18) * 0x18 + 0x18);
              }
              rand1_1._state = 0x5a5a5a5a;
              iVar16 = Imf_3_2::TiledOutputFile::numXLevels();
              std::vector<int,_std::allocator<int>_>::vector
                        (&tileYs,(long)iVar16,(allocator_type *)&out);
              uVar20 = local_1c4;
              iVar16 = Imf_3_2::TiledOutputFile::numYLevels();
              std::vector<int,_std::allocator<int>_>::vector
                        (&tileXs,(long)iVar16,(allocator_type *)&out);
              for (lVar55 = 0; iVar16 = Imf_3_2::TiledOutputFile::numXLevels(), lVar55 < iVar16;
                  lVar55 = lVar55 + 1) {
                tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[lVar55] = (int)lVar55;
              }
              for (lVar55 = 0; iVar16 = Imf_3_2::TiledOutputFile::numYLevels(), lVar55 < iVar16;
                  lVar55 = lVar55 + 1) {
                tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[lVar55] = (int)lVar55;
              }
              if ((uVar20 & 1) != 0) {
                for (lVar55 = 0; iVar16 = Imf_3_2::TiledOutputFile::numXLevels(),
                    piVar46 = tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start, lVar55 < iVar16; lVar55 = lVar55 + 1
                    ) {
                  iVar16 = Imf_3_2::TiledOutputFile::numXLevels();
                  fVar56 = (float)Imath_3_2::Rand32::nextf();
                  iVar17 = (int)((float)(iVar16 + -1) * fVar56 + (1.0 - fVar56) * (float)(int)lVar55
                                + 0.5);
                  iVar16 = piVar46[lVar55];
                  piVar46[lVar55] =
                       tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar17];
                  tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar17] = iVar16;
                }
                for (lVar55 = 0; iVar16 = Imf_3_2::TiledOutputFile::numYLevels(),
                    piVar46 = tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start, lVar55 < iVar16; lVar55 = lVar55 + 1
                    ) {
                  iVar16 = Imf_3_2::TiledOutputFile::numYLevels();
                  fVar56 = (float)Imath_3_2::Rand32::nextf();
                  iVar17 = (int)((float)(iVar16 + -1) * fVar56 + (1.0 - fVar56) * (float)(int)lVar55
                                + 0.5);
                  iVar16 = piVar46[lVar55];
                  piVar46[lVar55] =
                       tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar17];
                  tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar17] = iVar16;
                }
              }
              for (lVar55 = 0; iVar16 = Imf_3_2::TiledOutputFile::numYLevels(), lVar55 < iVar16;
                  lVar55 = lVar55 + 1) {
                iVar16 = tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar55];
                iVar17 = Imf_3_2::TiledOutputFile::numYTiles((int)&ph1);
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)&rand1,(long)iVar17,
                           (allocator_type *)&out);
                iVar17 = -1;
                for (lVar52 = 0; iVar18 = Imf_3_2::TiledOutputFile::numYTiles((int)&ph1),
                    lVar52 < iVar18; lVar52 = lVar52 + 1) {
                  if (bVar6) {
                    iVar18 = Imf_3_2::TiledOutputFile::numYTiles((int)&ph1);
                    *(int *)(rand1._state + (long)(iVar18 + iVar17) * 4) = (int)lVar52;
                  }
                  else {
                    *(int *)(rand1._state + lVar52 * 4) = (int)lVar52;
                  }
                  iVar17 = iVar17 + -1;
                }
                if ((local_1c4 & 1) != 0) {
                  for (lVar52 = 0; iVar17 = Imf_3_2::TiledOutputFile::numYTiles((int)&ph1),
                      lVar52 < iVar17; lVar52 = lVar52 + 1) {
                    RVar12._state = rand1._state;
                    iVar17 = Imf_3_2::TiledOutputFile::numYTiles((int)&ph1);
                    fVar56 = (float)Imath_3_2::Rand32::nextf();
                    lVar40 = (long)(int)((float)(iVar17 + -1) * fVar56 +
                                         (1.0 - fVar56) * (float)(int)lVar52 + 0.5);
                    uVar42 = *(undefined4 *)(RVar12._state + lVar52 * 4);
                    *(undefined4 *)(RVar12._state + lVar52 * 4) =
                         *(undefined4 *)(rand1._state + lVar40 * 4);
                    *(undefined4 *)(rand1._state + lVar40 * 4) = uVar42;
                  }
                }
                pcVar28 = (char *)0x0;
                while (iVar17 = Imf_3_2::TiledOutputFile::numXLevels(), (long)pcVar28 < (long)iVar17
                      ) {
                  iVar17 = tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)pcVar28];
                  local_1d0 = (ulong *)pcVar28;
                  iVar18 = Imf_3_2::TiledOutputFile::levelWidth((int)&ph1);
                  iVar70 = Imf_3_2::TiledOutputFile::levelHeight((int)&ph1);
                  lVar40 = (long)iVar18;
                  lVar52 = iVar70 * lVar40;
                  uVar38 = lVar52 * 2;
                  if (lVar52 < 0) {
                    uVar38 = 0xffffffffffffffff;
                  }
                  phVar29 = (half *)operator_new__(uVar38);
                  pAVar50 = (Array2D<Imath_3_2::half> *)
                            (__s + iVar16 * lVar54 * 3 + (long)iVar17 * 3);
                  if (pAVar50->_data != (half *)0x0) {
                    operator_delete__(pAVar50->_data);
                  }
                  pAVar50->_sizeX = (long)iVar70;
                  pAVar50->_sizeY = lVar40;
                  pAVar50->_data = phVar29;
                  fillPixels(pAVar50,iVar18,iVar70);
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                       0xffffffff00000000;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  Imf_3_2::Slice::Slice
                            ((Slice *)&out,HALF,(char *)pAVar50->_data,2,lVar40 * 2,1,1,0.0,false,
                             false);
                  Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca214);
                  Imf_3_2::TiledOutputFile::setFrameBuffer((FrameBuffer *)&ph1);
                  iVar18 = Imf_3_2::TiledOutputFile::numXTiles((int)&ph1);
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)&out,(long)iVar18,&local_1d1);
                  for (lVar52 = 0; iVar18 = Imf_3_2::TiledOutputFile::numXTiles((int)&ph1),
                      lVar52 < iVar18; lVar52 = lVar52 + 1) {
                    *(int *)(_out + lVar52 * 4) = (int)lVar52;
                  }
                  if ((local_1c4 & 1) != 0) {
                    for (lVar52 = 0; iVar18 = Imf_3_2::TiledOutputFile::numXTiles((int)&ph1),
                        puVar11 = _out, lVar52 < iVar18; lVar52 = lVar52 + 1) {
                      iVar18 = Imf_3_2::TiledOutputFile::numXTiles((int)&ph1);
                      fVar56 = (float)Imath_3_2::Rand32::nextf();
                      lVar40 = (long)(int)((float)(iVar18 + -1) * fVar56 +
                                           (1.0 - fVar56) * (float)(int)lVar52 + 0.5);
                      uVar42 = *(undefined4 *)(puVar11 + lVar52 * 4);
                      *(undefined4 *)(puVar11 + lVar52 * 4) = *(undefined4 *)(_out + lVar40 * 4);
                      *(undefined4 *)(_out + lVar40 * 4) = uVar42;
                    }
                  }
                  for (lVar52 = 0; iVar18 = Imf_3_2::TiledOutputFile::numYTiles((int)&ph1),
                      lVar52 < iVar18; lVar52 = lVar52 + 1) {
                    for (lVar40 = 0; iVar18 = Imf_3_2::TiledOutputFile::numXTiles((int)&ph1),
                        lVar40 < iVar18; lVar40 = lVar40 + 1) {
                      Imf_3_2::TiledOutputFile::writeTile
                                ((int)&ph1,*(int *)(_out + lVar40 * 4),
                                 *(int *)(rand1._state + lVar52 * 4),iVar17);
                    }
                  }
                  if (_out != (undefined1 *)0x0) {
                    operator_delete(_out,local_128 - (long)_out);
                  }
                  std::
                  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                               *)&fb);
                  pcVar28 = (char *)((long)local_1d0 + 1);
                }
                if (rand1._state != 0) {
                  operator_delete((void *)rand1._state,(long)local_d8 - rand1._state);
                }
              }
              if (tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              Imf_3_2::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&ph1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8)
              ;
              std::ostream::flush();
              iVar16 = Imf_3_2::globalThreadCount();
              Imf_3_2::TiledInputFile::TiledInputFile((TiledInputFile *)&ph1,_Var13._M_p,iVar16);
              Imf_3_2::TiledInputFile::header();
              piVar30 = (int *)Imf_3_2::Header::dataWindow();
              iVar16 = *piVar30;
              iVar17 = piVar30[1];
              uVar20 = Imf_3_2::TiledInputFile::numXLevels();
              uVar22 = Imf_3_2::TiledInputFile::numYLevels();
              lVar55 = (long)(int)uVar20;
              uVar48 = (int)uVar22 * lVar55;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = uVar48;
              uVar38 = SUB168(auVar5 * ZEXT816(0x18),0);
              uVar49 = uVar38 + 8;
              puVar44 = (ulong *)0xffffffffffffffff;
              if (0xfffffffffffffff7 < uVar38) {
                uVar49 = 0xffffffffffffffff;
              }
              if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
                uVar49 = 0xffffffffffffffff;
              }
              local_1d0 = (ulong *)operator_new__(uVar49);
              *local_1d0 = uVar48;
              __s_00 = local_1d0 + 1;
              if (uVar48 != 0) {
                puVar44 = (ulong *)0xaaaaaaaaaaaaaaab;
                memset(__s_00,0,((uVar38 - 0x18) / 0x18) * 0x18 + 0x18);
              }
              lVar52 = 0;
              while( true ) {
                uVar42 = SUB84(puVar44,0);
                iVar18 = Imf_3_2::TiledInputFile::numYLevels();
                if (iVar18 <= lVar52) break;
                if (local_1d8 == uVar19) {
                  iVar18 = Imf_3_2::TiledInputFile::numYTiles((int)&ph1);
                  iVar18 = iVar18 + -1;
                  iVar70 = -1;
                  local_1e8._0_4_ = -1;
                }
                else {
                  iVar70 = Imf_3_2::TiledInputFile::numYTiles((int)&ph1);
                  local_1e8._0_4_ = 1;
                  iVar18 = 0;
                }
                puVar44 = __s_00;
                for (uVar38 = 0; iVar23 = Imf_3_2::TiledInputFile::numXLevels(),
                    (long)uVar38 < (long)iVar23; uVar38 = uVar38 + 1) {
                  iVar23 = Imf_3_2::TiledInputFile::levelWidth((int)&ph1);
                  iVar51 = Imf_3_2::TiledInputFile::levelHeight((int)&ph1);
                  uVar49 = (ulong)iVar23;
                  lVar40 = (long)iVar51 * uVar49;
                  uVar48 = lVar40 * 2;
                  if (lVar40 < 0) {
                    uVar48 = 0xffffffffffffffff;
                  }
                  pvVar31 = operator_new__(uVar48);
                  puVar44 = __s_00 + lVar52 * lVar55 * 3 + uVar38 * 3;
                  if ((void *)puVar44[2] != (void *)0x0) {
                    operator_delete__((void *)puVar44[2]);
                  }
                  *puVar44 = (long)iVar51;
                  puVar44[1] = uVar49;
                  puVar44[2] = (ulong)pvVar31;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                       0xffffffff00000000;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                  puVar44 = (ulong *)0x2;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  Imf_3_2::Slice::Slice
                            ((Slice *)&out,HALF,
                             (char *)((long)pvVar31 + (long)iVar16 * -2 + uVar49 * -(long)iVar17 * 2
                                     ),2,uVar49 * 2,1,1,0.0,false,false);
                  Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca214);
                  Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&ph1);
                  for (iVar23 = iVar18; iVar23 != iVar70; iVar23 = iVar23 + (int)local_1e8) {
                    for (iVar51 = 0; iVar21 = Imf_3_2::TiledInputFile::numXTiles((int)&ph1),
                        iVar51 < iVar21; iVar51 = iVar51 + 1) {
                      puVar44 = (ulong *)(uVar38 & 0xffffffff);
                      Imf_3_2::TiledInputFile::readTile((int)&ph1,iVar51,iVar23,(int)uVar38);
                    }
                  }
                  std::
                  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                               *)&fb);
                }
                lVar52 = lVar52 + 1;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," comparing",10);
              std::ostream::flush();
              Imf_3_2::TiledInputFile::header();
              puVar32 = (undefined8 *)Imf_3_2::Header::displayWindow();
              puVar33 = (undefined8 *)Imf_3_2::Header::displayWindow();
              iVar16 = -(uint)((int)*puVar33 == (int)*puVar32);
              iVar17 = -(uint)((int)((ulong)*puVar33 >> 0x20) == (int)((ulong)*puVar32 >> 0x20));
              auVar65._4_4_ = iVar16;
              auVar65._0_4_ = iVar16;
              auVar65._8_4_ = iVar17;
              auVar65._12_4_ = iVar17;
              iVar16 = movmskpd(uVar42,auVar65);
              if ((iVar16 != 3) ||
                 (iVar17 = -(uint)((int)puVar33[1] == (int)puVar32[1]),
                 iVar18 = -(uint)((int)((ulong)puVar33[1] >> 0x20) ==
                                 (int)((ulong)puVar32[1] >> 0x20)), auVar66._4_4_ = iVar17,
                 auVar66._0_4_ = iVar17, auVar66._8_4_ = iVar18, auVar66._12_4_ = iVar18,
                 iVar17 = movmskpd((int)puVar33,auVar66), iVar17 != 3)) {
                __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,600,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              puVar32 = (undefined8 *)Imf_3_2::Header::dataWindow();
              puVar33 = (undefined8 *)Imf_3_2::Header::dataWindow();
              iVar17 = -(uint)((int)*puVar33 == (int)*puVar32);
              iVar18 = -(uint)((int)((ulong)*puVar33 >> 0x20) == (int)((ulong)*puVar32 >> 0x20));
              auVar67._4_4_ = iVar17;
              auVar67._0_4_ = iVar17;
              auVar67._8_4_ = iVar18;
              auVar67._12_4_ = iVar18;
              iVar16 = movmskpd(iVar16,auVar67);
              if ((iVar16 != 3) ||
                 (iVar16 = -(uint)((int)puVar33[1] == (int)puVar32[1]),
                 iVar17 = -(uint)((int)((ulong)puVar33[1] >> 0x20) ==
                                 (int)((ulong)puVar32[1] >> 0x20)), auVar68._4_4_ = iVar16,
                 auVar68._0_4_ = iVar16, auVar68._8_4_ = iVar17, auVar68._12_4_ = iVar17,
                 iVar16 = movmskpd((int)puVar33,auVar68), iVar16 != 3)) {
                __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x259,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pfVar34 = (float *)Imf_3_2::Header::pixelAspectRatio();
              fVar56 = *pfVar34;
              pfVar34 = (float *)Imf_3_2::Header::pixelAspectRatio();
              if ((fVar56 != *pfVar34) || (NAN(fVar56) || NAN(*pfVar34))) {
                __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x25a,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pfVar34 = (float *)Imf_3_2::Header::screenWindowCenter();
              pfVar35 = (float *)Imf_3_2::Header::screenWindowCenter();
              if ((((*pfVar34 != *pfVar35) || (NAN(*pfVar34) || NAN(*pfVar35))) ||
                  (pfVar34[1] != pfVar35[1])) || (NAN(pfVar34[1]) || NAN(pfVar35[1]))) {
                __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x25c,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pfVar34 = (float *)Imf_3_2::Header::screenWindowWidth();
              fVar56 = *pfVar34;
              pfVar34 = (float *)Imf_3_2::Header::screenWindowWidth();
              if ((fVar56 != *pfVar34) || (NAN(fVar56) || NAN(*pfVar34))) {
                __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x25d,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              piVar30 = (int *)Imf_3_2::Header::lineOrder();
              iVar16 = *piVar30;
              piVar30 = (int *)Imf_3_2::Header::lineOrder();
              if (iVar16 != *piVar30) {
                __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x25e,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              piVar30 = (int *)Imf_3_2::Header::compression();
              iVar16 = *piVar30;
              piVar30 = (int *)Imf_3_2::Header::compression();
              if (iVar16 != *piVar30) {
                __assert_fail("in.header ().compression () == hdr.compression ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x25f,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pCVar36 = (ChannelList *)Imf_3_2::Header::channels();
              pCVar37 = (ChannelList *)Imf_3_2::Header::channels();
              cVar15 = Imf_3_2::ChannelList::operator==(pCVar36,pCVar37);
              if (cVar15 == '\0') {
                __assert_fail("in.header ().channels () == hdr.channels ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x260,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              if (0 < (int)uVar22) {
                local_1e8 = 0;
                do {
                  if (0 < (int)uVar20) {
                    uVar38 = 0;
                    do {
                      lVar52 = 0;
                      for (local_210 = 0; iVar16 = Imf_3_2::TiledInputFile::levelHeight((int)&ph1),
                          local_210 < iVar16; local_210 = local_210 + 1) {
                        lVar40 = 0;
                        while (iVar16 = Imf_3_2::TiledInputFile::levelWidth((int)&ph1),
                              lVar40 < iVar16) {
                          fVar56 = *(float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)
                                                     (__s_00[local_1e8 * lVar55 * 3 + uVar38 * 3 + 1
                                                            ] * lVar52 +
                                                      __s_00[local_1e8 * lVar55 * 3 + uVar38 * 3 + 2
                                                            ] + lVar40 * 2) * 4);
                          lVar1 = lVar40 * 2;
                          lVar40 = lVar40 + 1;
                          pfVar34 = (float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)
                                                     (__s[local_1e8 * lVar54 * 3 + uVar38 * 3 + 1] *
                                                      lVar52 + __s[local_1e8 * lVar54 * 3 +
                                                                   uVar38 * 3 + 2] + lVar1) * 4);
                          if ((fVar56 != *pfVar34) || (NAN(fVar56) || NAN(*pfVar34))) {
                            __assert_fail("(levels2[ly][lx])[y][x] == (levels[ly][lx])[y][x]",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                                          ,0x267,
                                          "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                                         );
                          }
                        }
                        lVar52 = lVar52 + 2;
                      }
                      uVar38 = uVar38 + 1;
                    } while (uVar38 != uVar20);
                  }
                  local_1e8 = local_1e8 + 1;
                } while (local_1e8 != uVar22);
              }
              if (__s_00 != (ulong *)0x0) {
                if (*local_1d0 == 0) {
                  uVar38 = 8;
                }
                else {
                  lVar54 = *local_1d0 * 0x18;
                  lVar55 = lVar54;
                  do {
                    if (*(void **)((long)local_1d0 + lVar55) != (void *)0x0) {
                      operator_delete__(*(void **)((long)local_1d0 + lVar55));
                    }
                    lVar55 = lVar55 + -0x18;
                  } while (lVar55 != 0);
                  uVar38 = lVar54 + 8;
                }
                operator_delete__(local_1d0,uVar38);
              }
              Imf_3_2::TiledInputFile::~TiledInputFile((TiledInputFile *)&ph1);
              remove(_Var13._M_p);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
              std::ostream::put('X');
              std::ostream::flush();
              if (__s != (ulong *)0x0) {
                if (*puVar39 == 0) {
                  uVar38 = 8;
                }
                else {
                  lVar54 = *puVar39 * 0x18;
                  lVar55 = lVar54;
                  do {
                    if (*(void **)((long)puVar39 + lVar55) != (void *)0x0) {
                      operator_delete__(*(void **)((long)puVar39 + lVar55));
                    }
                    lVar55 = lVar55 + -0x18;
                  } while (lVar55 != 0);
                  uVar38 = lVar54 + 8;
                }
                operator_delete__(puVar39,uVar38);
              }
              Imf_3_2::Header::~Header(&hdr);
              bVar53 = 1;
              bVar14 = false;
            } while (bVar7);
            uVar19 = 1;
            bVar14 = false;
          } while (bVar8);
          local_1dc = 1;
          bVar14 = false;
        } while (bVar9);
        local_1d8 = 1;
        bVar6 = true;
        bVar14 = false;
      } while (bVar10);
    }
    uVar41 = uVar41 + 1;
    if (uVar41 == 10) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename._M_dataplus._M_p != &filename.field_2) {
        operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void
writeCopyRead (const std::string& tempDir, int w, int h, int xs, int ys)
{
    std::string filename = tempDir + "imf_test_copy.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
        if (comp == B44_COMPRESSION || comp == B44A_COMPRESSION) { continue; }

        for (int lorder = 0; lorder < RANDOM_Y; ++lorder)
        {
            for (int rmode = 0; rmode < NUM_ROUNDINGMODES; ++rmode)
            {
                for (int tb = 0; tb <= 1; ++tb)
                {
                    for (int ts = 0; ts <= 1; ++ts)
                    {
                        writeCopyReadONE (
                            filename.c_str (),
                            w,
                            h,
                            (LineOrder) lorder,
                            (LevelRoundingMode) rmode,
                            xs,
                            ys,
                            Compression (comp),
                            (bool) tb,
                            (bool) ts);

                        writeCopyReadMIP (
                            filename.c_str (),
                            w,
                            h,
                            (LineOrder) lorder,
                            (LevelRoundingMode) rmode,
                            xs,
                            ys,
                            Compression (comp),
                            (bool) tb,
                            (bool) ts);

                        writeCopyReadRIP (
                            filename.c_str (),
                            w,
                            h,
                            (LineOrder) lorder,
                            (LevelRoundingMode) rmode,
                            xs,
                            ys,
                            Compression (comp),
                            (bool) tb,
                            (bool) ts);
                    }
                }
            }
        }
    }
}